

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseDocument(htmlParserCtxtPtr ctxt)

{
  setDocumentLocatorSAXFunc p_Var1;
  void *pvVar2;
  int iVar3;
  xmlSAXLocator *pxVar4;
  xmlDtdPtr pxVar5;
  bool bVar6;
  xmlDtdPtr dtd;
  xmlCharEncoding enc;
  xmlChar start [4];
  htmlParserCtxtPtr ctxt_local;
  
  _enc = ctxt;
  xmlInitParser();
  htmlDefaultSAXHandlerInit();
  if ((_enc == (xmlParserCtxtPtr)0x0) || (_enc->input == (xmlParserInputPtr)0x0)) {
    htmlParseErr(_enc,XML_ERR_INTERNAL_ERROR,"htmlParseDocument: context error\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    ctxt_local._4_4_ = 1;
  }
  else {
    _enc->html = 1;
    _enc->linenumbers = 1;
    if ((_enc->progressive == 0) && ((long)_enc->input->end - (long)_enc->input->cur < 0xfa)) {
      xmlParserInputGrow(_enc->input,0xfa);
    }
    if ((_enc->sax != (_xmlSAXHandler *)0x0) &&
       (_enc->sax->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0)) {
      p_Var1 = _enc->sax->setDocumentLocator;
      pvVar2 = _enc->userData;
      pxVar4 = __xmlDefaultSAXLocator();
      (*p_Var1)(pvVar2,pxVar4);
    }
    if ((_enc->encoding == (xmlChar *)0x0) && (3 < (long)_enc->input->end - (long)_enc->input->cur))
    {
      if (_enc->token == 0) {
        dtd._4_1_ = *_enc->input->cur;
      }
      else {
        dtd._4_1_ = 0xff;
      }
      dtd._5_1_ = _enc->input->cur[1];
      dtd._6_1_ = _enc->input->cur[2];
      dtd._7_1_ = _enc->input->cur[3];
      dtd._0_4_ = xmlDetectCharEncoding((uchar *)((long)&dtd + 4),4);
      if ((xmlCharEncoding)dtd != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(_enc,(xmlCharEncoding)dtd);
      }
    }
    htmlSkipBlankChars(_enc);
    if (*_enc->input->cur == '\0') {
      htmlParseErr(_enc,XML_ERR_DOCUMENT_EMPTY,"Document is empty\n",(xmlChar *)0x0,(xmlChar *)0x0);
    }
    if (((_enc->sax != (_xmlSAXHandler *)0x0) &&
        (_enc->sax->startDocument != (startDocumentSAXFunc)0x0)) && (_enc->disableSAX == 0)) {
      (*_enc->sax->startDocument)(_enc->userData);
    }
    while( true ) {
      if ((((*_enc->input->cur != '<') || (_enc->input->cur[1] != '!')) ||
          ((_enc->input->cur[2] != '-' || (bVar6 = true, _enc->input->cur[3] != '-')))) &&
         (bVar6 = false, *_enc->input->cur == '<')) {
        bVar6 = _enc->input->cur[1] == '?';
      }
      if (!bVar6) break;
      htmlParseComment(_enc);
      htmlParsePI(_enc);
      htmlSkipBlankChars(_enc);
    }
    if (((*_enc->input->cur == '<') && (_enc->input->cur[1] == '!')) &&
       (((iVar3 = toupper((uint)_enc->input->cur[2]), iVar3 == 0x44 &&
         (((iVar3 = toupper((uint)_enc->input->cur[3]), iVar3 == 0x4f &&
           (iVar3 = toupper((uint)_enc->input->cur[4]), iVar3 == 0x43)) &&
          (iVar3 = toupper((uint)_enc->input->cur[5]), iVar3 == 0x54)))) &&
        (((iVar3 = toupper((uint)_enc->input->cur[6]), iVar3 == 0x59 &&
          (iVar3 = toupper((uint)_enc->input->cur[7]), iVar3 == 0x50)) &&
         (iVar3 = toupper((uint)_enc->input->cur[8]), iVar3 == 0x45)))))) {
      htmlParseDocTypeDecl(_enc);
    }
    htmlSkipBlankChars(_enc);
    while( true ) {
      if ((((*_enc->input->cur != '<') || (_enc->input->cur[1] != '!')) ||
          ((_enc->input->cur[2] != '-' || (bVar6 = true, _enc->input->cur[3] != '-')))) &&
         (bVar6 = false, *_enc->input->cur == '<')) {
        bVar6 = _enc->input->cur[1] == '?';
      }
      if (!bVar6) break;
      htmlParseComment(_enc);
      htmlParsePI(_enc);
      htmlSkipBlankChars(_enc);
    }
    htmlParseContentInternal(_enc);
    if (*_enc->input->cur == '\0') {
      htmlAutoCloseOnEnd(_enc);
    }
    if ((_enc->sax != (_xmlSAXHandler *)0x0) && (_enc->sax->endDocument != (endDocumentSAXFunc)0x0))
    {
      (*_enc->sax->endDocument)(_enc->userData);
    }
    if ((((_enc->options & 4U) == 0) && (_enc->myDoc != (xmlDocPtr)0x0)) &&
       (pxVar5 = xmlGetIntSubset(_enc->myDoc), pxVar5 == (xmlDtdPtr)0x0)) {
      pxVar5 = xmlCreateIntSubset(_enc->myDoc,"html",
                                  (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                  (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
      _enc->myDoc->intSubset = pxVar5;
    }
    if (_enc->wellFormed == 0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
htmlParseDocument(htmlParserCtxtPtr ctxt) {
    xmlChar start[4];
    xmlCharEncoding enc;
    xmlDtdPtr dtd;

    xmlInitParser();

    htmlDefaultSAXHandlerInit();

    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseDocument: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    ctxt->html = 1;
    ctxt->linenumbers = 1;
    GROW;
    /*
     * SAX: beginning of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator))
        ctxt->sax->setDocumentLocator(ctxt->userData, &xmlDefaultSAXLocator);

    if ((ctxt->encoding == (const xmlChar *)XML_CHAR_ENCODING_NONE) &&
        ((ctxt->input->end - ctxt->input->cur) >= 4)) {
	/*
	 * Get the 4 first bytes and decode the charset
	 * if enc != XML_CHAR_ENCODING_NONE
	 * plug some encoding conversion routines.
	 */
	start[0] = RAW;
	start[1] = NXT(1);
	start[2] = NXT(2);
	start[3] = NXT(3);
	enc = xmlDetectCharEncoding(&start[0], 4);
	if (enc != XML_CHAR_ENCODING_NONE) {
	    xmlSwitchEncoding(ctxt, enc);
	}
    }

    /*
     * Wipe out everything which is before the first '<'
     */
    SKIP_BLANKS;
    if (CUR == 0) {
	htmlParseErr(ctxt, XML_ERR_DOCUMENT_EMPTY,
	             "Document is empty\n", NULL, NULL);
    }

    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
	ctxt->sax->startDocument(ctxt->userData);


    /*
     * Parse possible comments and PIs before any content
     */
    while (((CUR == '<') && (NXT(1) == '!') &&
            (NXT(2) == '-') && (NXT(3) == '-')) ||
	   ((CUR == '<') && (NXT(1) == '?'))) {
        htmlParseComment(ctxt);
        htmlParsePI(ctxt);
	SKIP_BLANKS;
    }


    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    if ((CUR == '<') && (NXT(1) == '!') &&
	(UPP(2) == 'D') && (UPP(3) == 'O') &&
	(UPP(4) == 'C') && (UPP(5) == 'T') &&
	(UPP(6) == 'Y') && (UPP(7) == 'P') &&
	(UPP(8) == 'E')) {
	htmlParseDocTypeDecl(ctxt);
    }
    SKIP_BLANKS;

    /*
     * Parse possible comments and PIs before any content
     */
    while (((CUR == '<') && (NXT(1) == '!') &&
            (NXT(2) == '-') && (NXT(3) == '-')) ||
	   ((CUR == '<') && (NXT(1) == '?'))) {
        htmlParseComment(ctxt);
        htmlParsePI(ctxt);
	SKIP_BLANKS;
    }

    /*
     * Time to start parsing the tree itself
     */
    htmlParseContentInternal(ctxt);

    /*
     * autoclose
     */
    if (CUR == 0)
	htmlAutoCloseOnEnd(ctxt);


    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) && (ctxt->myDoc != NULL)) {
	dtd = xmlGetIntSubset(ctxt->myDoc);
	if (dtd == NULL)
	    ctxt->myDoc->intSubset =
		xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
		    BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
		    BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
    }
    if (! ctxt->wellFormed) return(-1);
    return(0);
}